

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void Catch::loadTestNamesFromFile(ConfigData *config,string *_filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  bool bVar3;
  istream *piVar4;
  long *plVar5;
  domain_error *this;
  size_type *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string line;
  ifstream f;
  string local_2a0;
  string local_280;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long local_238 [65];
  
  std::ifstream::ifstream((istream *)local_238,(_filename->_M_dataplus)._M_p,_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    local_280._M_string_length = 0;
    local_280.field_2._M_local_buf[0] = '\0';
    paVar1 = &local_2a0.field_2;
    local_260 = &config->testsOrTags;
    while( true ) {
      cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_280,cVar2);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      trim(&local_2a0,&local_280);
      std::__cxx11::string::operator=((string *)&local_280,(string *)&local_2a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2a0._M_dataplus._M_p);
      }
      if (local_280._M_string_length != 0) {
        local_2a0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"#","");
        bVar3 = startsWith(&local_280,&local_2a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != paVar1) {
          operator_delete(local_2a0._M_dataplus._M_p);
        }
        if (!bVar3) {
          local_2a0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"\"","");
          bVar3 = startsWith(&local_280,&local_2a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != paVar1) {
            operator_delete(local_2a0._M_dataplus._M_p);
          }
          if (!bVar3) {
            std::operator+(&local_258,"\"",&local_280);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_258);
            psVar6 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_2a0.field_2._M_allocated_capacity = *psVar6;
              local_2a0.field_2._8_8_ = plVar5[3];
              local_2a0._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_2a0.field_2._M_allocated_capacity = *psVar6;
              local_2a0._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_2a0._M_string_length = plVar5[1];
            *plVar5 = (long)psVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_280,(string *)&local_2a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a0._M_dataplus._M_p != paVar1) {
              operator_delete(local_2a0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._M_dataplus._M_p != &local_258.field_2) {
              operator_delete(local_258._M_dataplus._M_p);
            }
          }
          local_2a0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2a0,local_280._M_dataplus._M_p,
                     local_280._M_dataplus._M_p + local_280._M_string_length);
          std::__cxx11::string::append((char *)&local_2a0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_260,&local_2a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != paVar1) {
            operator_delete(local_2a0._M_dataplus._M_p);
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p);
    }
    std::ifstream::~ifstream(local_238);
    return;
  }
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_280,"Unable to load input file: ",_filename);
  std::domain_error::domain_error(this,(string *)&local_280);
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

inline void loadTestNamesFromFile( ConfigData& config, std::string const& _filename ) {
        std::ifstream f( _filename.c_str() );
        if( !f.is_open() )
            throw std::domain_error( "Unable to load input file: " + _filename );

        std::string line;
        while( std::getline( f, line ) ) {
            line = trim(line);
            if( !line.empty() && !startsWith( line, "#" ) ) {
                if( !startsWith( line, "\"" ) )
                    line = "\"" + line + "\"";
                addTestOrTags( config, line + "," );
            }
        }
    }